

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void insert_fully_flipped_container(roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb)

{
  int iVar1;
  container_t *pcVar2;
  container_t *container_to_flip;
  container_t *flipped_container;
  uint8_t ctype_out;
  int32_t iStack_20;
  uint8_t ctype_in;
  int j;
  int i;
  uint16_t hb_local;
  roaring_array_t *x1_arr_local;
  roaring_array_t *ans_arr_local;
  
  j._2_2_ = hb;
  _i = x1_arr;
  x1_arr_local = ans_arr;
  iStack_20 = ra_get_index(x1_arr,hb);
  flipped_container._4_4_ = ra_get_index(x1_arr_local,j._2_2_);
  if (iStack_20 < 0) {
    pcVar2 = container_range_of_ones(0,0x10000,(uint8_t *)((long)&flipped_container + 2));
    ra_insert_new_key_value_at
              (x1_arr_local,-1 - flipped_container._4_4_,j._2_2_,pcVar2,flipped_container._2_1_);
  }
  else {
    pcVar2 = ra_get_container_at_index
                       (_i,(uint16_t)iStack_20,(uint8_t *)((long)&flipped_container + 3));
    pcVar2 = container_not(pcVar2,flipped_container._3_1_,(uint8_t *)((long)&flipped_container + 2))
    ;
    iVar1 = container_get_cardinality(pcVar2,flipped_container._2_1_);
    if (iVar1 == 0) {
      container_free(pcVar2,flipped_container._2_1_);
    }
    else {
      ra_insert_new_key_value_at
                (x1_arr_local,-1 - flipped_container._4_4_,j._2_2_,pcVar2,flipped_container._2_1_);
    }
  }
  return;
}

Assistant:

static void insert_fully_flipped_container(roaring_array_t *ans_arr,
                                           const roaring_array_t *x1_arr,
                                           uint16_t hb) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container =
            container_not(container_to_flip, ctype_in, &ctype_out);
        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(0U, 0x10000U, &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}